

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void __thiscall
clip_model_loader::get_f32(clip_model_loader *this,string *key,float *output,bool required)

{
  uint uVar1;
  runtime_error *this_00;
  float fVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = gguf_find_key((this->ctx_gguf)._M_t.
                        super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                        super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                        (key->_M_dataplus)._M_p);
  if ((int)uVar1 < 0) {
    if (required) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Key not found: ",key);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    fVar2 = (float)gguf_get_val_f32((this->ctx_gguf)._M_t.
                                    super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                    super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                    super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                                    uVar1 & 0x7fffffff);
    *output = fVar2;
  }
  return;
}

Assistant:

void get_f32(const std::string & key, float & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        output = gguf_get_val_f32(ctx_gguf.get(), i);
    }